

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * RazorAHRSThread(void *pParam)

{
  int iVar1;
  undefined1 local_90 [8];
  RAZORAHRSDATA razorahrsdata;
  int err;
  int res;
  int id;
  RAZORAHRS *pRazorAHRS;
  void *pParam_local;
  
  err = 0;
  razorahrsdata.Yaw._4_4_ = 0;
  do {
    if (addrsRazorAHRS[err] == pParam) {
      memset(local_90,0,0x60);
      do {
        mSleep((long)*(int *)((long)pParam + 0x588));
        iVar1 = GetLatestDataRazorAHRS((RAZORAHRS *)pParam,(RAZORAHRSDATA *)local_90);
        if (iVar1 != 0) {
          razorahrsdata.Yaw._4_4_ = iVar1;
        }
        EnterCriticalSection(RazorAHRSCS + err);
        memcpy(razorahrsdataRazorAHRS + err,local_90,0x60);
        resRazorAHRS[err] = razorahrsdata.Yaw._4_4_;
        LeaveCriticalSection(RazorAHRSCS + err);
      } while (bExitRazorAHRS[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS* pRazorAHRS = (RAZORAHRS*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	RAZORAHRSDATA razorahrsdata;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&razorahrsdata, 0, sizeof(RAZORAHRSDATA));
	for (;;)
	{
		mSleep(pRazorAHRS->threadperiod);
		//memset(&razorahrsdata, 0, sizeof(RAZORAHRSDATA));
		res = GetLatestDataRazorAHRS(pRazorAHRS, &razorahrsdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetLatestDataRazorAHRS(pRazorAHRS, &razorahrsdata) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RazorAHRSCS[id]);
			razorahrsdataRazorAHRS[id] = razorahrsdata;
			resRazorAHRS[id] = err;
			LeaveCriticalSection(&RazorAHRSCS[id]);
		}
		if (bExitRazorAHRS[id]) break;
	}

	return 0;
}